

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expreplay.h
# Opt level: O2

void ExpReplay::multipredict
               (expreplay *param_1,single_learner *base,example *ec,size_t count,size_t step,
               polyprediction *pred,bool finalize_predictions)

{
  LEARNER::learner<char,_example>::multipredict(base,ec,count,step,pred,finalize_predictions);
  return;
}

Assistant:

void multipredict(expreplay&, LEARNER::single_learner& base, example& ec, size_t count, size_t step,
    polyprediction* pred, bool finalize_predictions)
{
  base.multipredict(ec, count, step, pred, finalize_predictions);
}